

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::SimpleSequenceExprSyntax::setChild
          (SimpleSequenceExprSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  SequenceRepetitionSyntax *pSVar2;
  
  pSVar1 = TokenOrSyntax::node(&child);
  if (index == 0) {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->expr).ptr = (ExpressionSyntax *)pSVar1;
  }
  else {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar2 = (SequenceRepetitionSyntax *)0x0;
    }
    else {
      pSVar2 = (SequenceRepetitionSyntax *)TokenOrSyntax::node(&child);
    }
    this->repetition = pSVar2;
  }
  return;
}

Assistant:

void SimpleSequenceExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: repetition = child.node() ? &child.node()->as<SequenceRepetitionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}